

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# S2Test.cpp
# Opt level: O1

void __thiscall testForceOnSo3::test_method(testForceOnSo3 *this)

{
  double dVar1;
  double dVar2;
  int iVar3;
  Index outer_stride;
  double *__ptr;
  double *__ptr_00;
  Index i;
  long lVar4;
  VectorXd perturbedRotVec;
  S2 S;
  Point rot;
  double *local_278;
  long lStack_270;
  double *local_248;
  undefined8 uStack_240;
  undefined1 local_228;
  undefined8 local_220;
  shared_count sStack_218;
  char *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  S2 local_1d0 [144];
  void *local_140;
  ConstSubPoint local_130 [272];
  
  mnf::S2::S2(local_1d0);
  free((void *)0x0);
  __ptr = Eigen::internal::conditional_aligned_new_auto<double,true>(3);
  __ptr_00 = Eigen::internal::conditional_aligned_new_auto<double,true>(3);
  mnf::Manifold::createRandomPoint(1.0);
  lVar4 = 0;
  do {
    iVar3 = rand();
    __ptr_00[lVar4] = (((double)iVar3 + (double)iVar3) / 2147483647.0 + -1.0) * 0.01;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  mnf::SubPoint::value();
  if (lStack_270 == 3) {
    dVar1 = local_278[1];
    dVar2 = __ptr_00[1];
    *__ptr = *__ptr_00 + *local_278;
    __ptr[1] = dVar2 + dVar1;
    __ptr[2] = local_278[2] + __ptr_00[2];
    uStack_240 = 3;
    local_248 = __ptr;
    mnf::Manifold::forceOnM(local_1d0,&local_248);
    free((void *)0x0);
    local_1e0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/S2Test.cpp"
    ;
    local_1d8 = "";
    local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1e0,0x5c);
    local_228 = mnf::Manifold::isInM((Matrix *)local_1d0,1e-08);
    local_220 = 0;
    sStack_218.pi_ = (sp_counted_base *)0x0;
    local_200 = "S.isInM(perturbedRotVec)";
    local_1f8 = "";
    local_210 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/S2Test.cpp"
    ;
    local_208 = "";
    boost::test_tools::tt_detail::report_assertion();
    boost::detail::shared_count::~shared_count(&sStack_218);
    mnf::ConstSubPoint::~ConstSubPoint(local_130);
    free(local_140);
    free(__ptr_00);
    free(__ptr);
    mnf::Manifold::~Manifold((Manifold *)local_1d0);
    return;
  }
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Ref<Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

BOOST_AUTO_TEST_CASE(testForceOnSo3)
{
  S2 S;
  Eigen::VectorXd perturbedRotVec(3);
  Eigen::VectorXd randM(3);
  Point rot = S.createRandomPoint();
  randM = 0.01 * Eigen::VectorXd::Random(3);
  perturbedRotVec = rot.value() + randM;
  S.forceOnM(perturbedRotVec, perturbedRotVec);
  BOOST_CHECK(S.isInM(perturbedRotVec));
}